

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDX;
  size_t extraout_RDX;
  FilePath FVar3;
  String *in_stack_ffffffffffffff60;
  String local_50 [2];
  undefined1 local_30 [8];
  String dot_extension;
  char *extension_local;
  FilePath *this_local;
  
  String::Format((String *)local_30,".%s",in_RDX);
  pcVar2 = String::c_str((String *)local_30);
  bVar1 = String::EndsWithCaseInsensitive((String *)extension,pcVar2);
  if (bVar1) {
    pcVar2 = String::c_str((String *)extension);
    in_stack_ffffffffffffff60 = (String *)String::length((String *)extension);
    String::String(local_50,pcVar2,(size_t)((long)&in_stack_ffffffffffffff60[-1].length_ + 4));
    FilePath(this,local_50);
    String::~String(in_stack_ffffffffffffff60);
  }
  else {
    FilePath(this,(FilePath *)extension);
  }
  String::~String(in_stack_ffffffffffffff60);
  FVar3.pathname_.length_ = extraout_RDX;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}